

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O3

void __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  pointer puVar1;
  pointer puVar2;
  double dVar3;
  uint64_t x_00;
  BigInt<unsigned_int,_unsigned_long> *this_00;
  ulong uVar4;
  uint uVar5;
  BigInt<unsigned_int,_unsigned_long> local_48;
  double local_28;
  
  local_28 = x;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::Frac
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._vptr_Frac =
       (_func_int **)&PTR__Frac_00110bc8;
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_48,0x10000000000000);
  dVar3 = local_28;
  uVar4 = (ulong)local_28 & 0xfffffffffffff;
  puVar1 = (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._positive = local_48._positive;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._positive = local_48._positive;
    if (local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48._values.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48._values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48._values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_48,uVar4 + 0x10000000000000);
  uVar5 = (uint)((ulong)dVar3 >> 0x34) & 0x7ff;
  puVar1 = (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._positive = local_48._positive;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._positive = local_48._positive;
    if (local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48._values.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48._values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48._values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (uVar5 < 0x3ff) {
    this_00 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q;
    x_00 = 0x3ff - (ulong)uVar5;
  }
  else {
    if (uVar5 == 0x3ff) goto LAB_0010405f;
    this_00 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p;
    x_00 = (ulong)uVar5 - 0x3ff;
  }
  BigInt<unsigned_int,_unsigned_long>::operator<<=(this_00,x_00);
LAB_0010405f:
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::_simplify
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  return;
}

Assistant:

constexpr Rational<TInteger>::Rational(double x) : Frac<TInteger>()
	{
		const uint64_t raw = *reinterpret_cast<uint64_t*>(&x);

		constexpr uint64_t signFilter = 0x8000000000000000;
		constexpr uint64_t exponentFilter = 0x7FF0000000000000;
		constexpr uint8_t exponentShift = 52;
		constexpr uint64_t mantissaFilter = 0x000FFFFFFFFFFFFF;
		constexpr uint64_t mantissaDivisor = 0x0010000000000000;

		bool negative = (raw & signFilter) != 0;
		uint64_t exponent = (raw & exponentFilter) >> exponentShift;
		uint64_t mantissa = (raw & mantissaFilter);

		_q = mantissaDivisor;
		_p = mantissaDivisor + mantissa;

		if (exponent < 1023)
		{
			_q <<= 1023 - exponent;
		}
		else if (exponent > 1023)
		{
			_p <<= exponent - 1023;
		}

		_simplify();
	}